

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O3

set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
* __thiscall
CsSignal::SlotBase::internal_senderList
          (set<CsSignal::SignalBase_*,_std::less<CsSignal::SignalBase_*>,_std::allocator<CsSignal::SignalBase_*>_>
           *__return_storage_ptr__,SlotBase *this)

{
  _Rb_tree_header *p_Var1;
  atomic<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>::zombie_list_node_*>
  *paVar2;
  __pointer_type pzVar3;
  __pointer_type pnVar5;
  bool bVar6;
  read_handle receiverListHandle;
  read_handle local_40;
  SignalBase *local_20;
  __pointer_type pzVar4;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40.m_ptr = &(this->m_possibleSenders).m_obj;
  local_40.m_accessed = false;
  local_40.m_guard.m_list = local_40.m_ptr;
  local_40.m_guard.m_zombie = (zombie_list_node *)operator_new(0x18);
  ((local_40.m_guard.m_zombie)->next)._M_b._M_p = (__pointer_type)0x0;
  ((local_40.m_guard.m_zombie)->owner)._M_b._M_p = &local_40.m_guard;
  (local_40.m_guard.m_zombie)->zombie_node = (node *)0x0;
  pzVar4 = (this->m_possibleSenders).m_obj.m_zombie_head._M_b._M_p;
  ((local_40.m_guard.m_zombie)->next)._M_b._M_p = pzVar4;
  while( true ) {
    paVar2 = &(this->m_possibleSenders).m_obj.m_zombie_head;
    LOCK();
    pzVar3 = (paVar2->_M_b)._M_p;
    bVar6 = pzVar4 == pzVar3;
    if (bVar6) {
      (paVar2->_M_b)._M_p = local_40.m_guard.m_zombie;
      pzVar3 = pzVar4;
    }
    UNLOCK();
    if (bVar6) break;
    ((local_40.m_guard.m_zombie)->next)._M_b._M_p = pzVar3;
    pzVar4 = pzVar3;
  }
  local_40.m_accessed = true;
  pnVar5 = (((rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
              *)&(local_40.m_ptr)->m_head)->m_head)._M_b._M_p;
  if (pnVar5 != (__pointer_type)0x0) {
    do {
      local_20 = pnVar5->data;
      std::
      _Rb_tree<CsSignal::SignalBase*,CsSignal::SignalBase*,std::_Identity<CsSignal::SignalBase*>,std::less<CsSignal::SignalBase*>,std::allocator<CsSignal::SignalBase*>>
      ::_M_insert_unique<CsSignal::SignalBase*>
                ((_Rb_tree<CsSignal::SignalBase*,CsSignal::SignalBase*,std::_Identity<CsSignal::SignalBase*>,std::less<CsSignal::SignalBase*>,std::allocator<CsSignal::SignalBase*>>
                  *)__return_storage_ptr__,&local_20);
      pnVar5 = (pnVar5->next)._M_b._M_p;
    } while (pnVar5 != (__pointer_type)0x0);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
  ::read_handle::~read_handle(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SignalBase *> CsSignal::SlotBase::internal_senderList() const
{
   std::set<SignalBase *> retval;

   auto receiverListHandle = m_possibleSenders.lock_read();

   for (auto &sender : *receiverListHandle) {
      retval.insert(const_cast<SignalBase *>(sender));
   }

   return retval;
}